

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

size_t WriteDataToDisk(FILE *file,char *buf,size_t len)

{
  size_t sVar1;
  ostream *poVar2;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (file == (FILE *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_5c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"WriteDataToDisk","");
    poVar2 = Logger::Start(ERR,&local_38,0xc2,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"file",4);
    std::operator<<(poVar2," == NULL \n");
  }
  else if (buf == (char *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_5c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"WriteDataToDisk","");
    poVar2 = Logger::Start(ERR,&local_38,0xc3,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"buf",3);
    std::operator<<(poVar2," == NULL \n");
  }
  else {
    if (len != 0) {
      sVar1 = fwrite(buf,1,len,(FILE *)file);
      if (sVar1 != len) {
        local_5c.severity_ = FATAL;
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                   ,"");
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"WriteDataToDisk","");
        poVar2 = Logger::Start(FATAL,&local_38,199,&local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Error: invoke fwrite().",0x17);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p);
        }
        Logger::~Logger(&local_5c);
      }
      return sVar1;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_5c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"WriteDataToDisk","");
    poVar2 = Logger::Start(ERR,&local_38,0xc4,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xc4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"len",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

inline size_t WriteDataToDisk(FILE *file, const char *buf, size_t len) {
  CHECK_NOTNULL(file);
  CHECK_NOTNULL(buf);
  CHECK_GT(len, 0);
  size_t write_len = fwrite(buf, 1, len, file);
  if (write_len != len) {
    LOG(FATAL) << "Error: invoke fwrite().";
  }
  return write_len;
}